

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuReduce.c
# Opt level: O3

int Fxu_PreprocessCubePairs(Fxu_Matrix *p,Vec_Ptr_t *vCovers,int nPairsTotal,int nPairsMax)

{
  long lVar1;
  char *pcVar2;
  Fxu_Var *pFVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  int *__s_00;
  int iVar6;
  int iVar7;
  long lVar8;
  Fxu_Cube *pFVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char cVar14;
  ulong uVar15;
  long lVar16;
  size_t __size;
  Fxu_Cube *pCube1;
  Fxu_Cube *pCube2;
  
  if (nPairsTotal <= nPairsMax) {
    __assert_fail("nPairsMax < nPairsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                  ,0x43,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
  }
  __s = malloc((long)nPairsTotal);
  memset(__s,0xff,(long)nPairsTotal);
  iVar4 = vCovers->nSize;
  if (iVar4 < 1) {
    iVar6 = 0;
    iVar7 = -1;
  }
  else {
    iVar7 = -1;
    lVar8 = 0;
    iVar6 = 0;
    do {
      pcVar11 = (char *)vCovers->pArray[lVar8];
      if (pcVar11 != (char *)0x0) {
        iVar4 = Abc_SopGetVarNum(pcVar11);
        uVar5 = Abc_SopGetVarNum(pcVar11);
        if (*pcVar11 != '\0') {
          lVar1 = (long)(int)uVar5 + 3;
          iVar10 = 0;
          pcVar13 = pcVar11;
          pcVar12 = pcVar11;
          do {
            if (pcVar12 != pcVar13) {
              if ((int)uVar5 < 1) {
                cVar14 = '\0';
              }
              else {
                uVar15 = 0;
                cVar14 = '\0';
                do {
                  cVar14 = cVar14 + (pcVar12[uVar15] != pcVar13[uVar15]);
                  uVar15 = uVar15 + 1;
                } while (uVar5 != uVar15);
              }
              lVar16 = (long)iVar10;
              iVar10 = iVar10 + 1;
              *(char *)((long)__s + lVar16 + iVar6) = cVar14;
            }
            pcVar2 = pcVar13 + lVar1;
            pcVar13 = pcVar13 + lVar1;
          } while ((*pcVar2 != '\0') ||
                  (pcVar2 = pcVar12 + lVar1, pcVar13 = pcVar12 + lVar1, pcVar12 = pcVar13,
                  *pcVar2 != '\0'));
        }
        iVar10 = Abc_SopGetCubeNum(pcVar11);
        iVar6 = iVar6 + ((iVar10 + -1) * iVar10) / 2;
        if (iVar7 <= iVar4) {
          iVar7 = iVar4;
        }
        iVar4 = vCovers->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
  if (iVar6 != nPairsTotal) {
    __assert_fail("iPair == nPairsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                  ,0x56,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
  }
  __size = (long)(iVar7 * 2) << 2;
  __s_00 = (int *)malloc(__size);
  memset(__s_00,0xff,__size);
  memset(__s_00,0,(long)iVar7 << 3);
  if (0 < nPairsTotal) {
    uVar15 = 0;
    do {
      __s_00[*(byte *)((long)__s + uVar15)] = __s_00[*(byte *)((long)__s + uVar15)] + 1;
      uVar15 = uVar15 + 1;
    } while ((uint)nPairsTotal != uVar15);
  }
  if (*__s_00 == 0) {
    if (__s_00[1] == 0) {
      uVar5 = 0xffffffff;
      if (0 < iVar7) {
        uVar15 = 0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + __s_00[uVar15];
          if (nPairsMax <= iVar6) {
            iVar6 = (__s_00[uVar15] + nPairsMax) - iVar6;
            uVar5 = (uint)uVar15;
            goto LAB_00443fa6;
          }
          uVar15 = uVar15 + 1;
        } while ((uint)(iVar7 * 2) != uVar15);
      }
      iVar6 = -1;
LAB_00443fa6:
      free(__s_00);
      if (nPairsTotal < 1) {
        iVar7 = 0;
      }
      else {
        uVar15 = 0;
        iVar10 = 0;
        iVar7 = 0;
        do {
          if ((int)uVar5 < (int)(uint)*(byte *)((long)__s + uVar15)) {
            *(undefined1 *)((long)__s + uVar15) = 0;
          }
          else if (uVar5 == *(byte *)((long)__s + uVar15)) {
            if (iVar10 < iVar6) {
              iVar7 = iVar7 + 1;
              iVar10 = iVar10 + 1;
            }
            else {
              *(undefined1 *)((long)__s + uVar15) = 0;
              iVar10 = iVar10 + 1;
            }
          }
          else {
            iVar7 = iVar7 + 1;
          }
          uVar15 = uVar15 + 1;
        } while ((uint)nPairsTotal != uVar15);
      }
      if (iVar7 != nPairsMax) {
        __assert_fail("iPair == nPairsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0x8c,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      if (iVar4 < 1) {
        iVar7 = 0;
      }
      else {
        lVar8 = 0;
        iVar7 = 0;
        do {
          if (vCovers->pArray[lVar8] != (void *)0x0) {
            pFVar3 = p->ppVars[lVar8 * 2 + 1];
            pCube1 = pFVar3->pFirst;
            iVar6 = pFVar3->nCubes;
            pFVar9 = pCube1;
            if (0 < iVar6) {
              do {
                pFVar9 = pFVar9->pNext;
                iVar6 = iVar6 + -1;
              } while (iVar6 != 0);
            }
            if ((pFVar9 != (Fxu_Cube *)0x0) && (pFVar9->pVar == pFVar3)) {
              __assert_fail("pCubeLast == NULL || pCubeLast->pVar != pVar",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                            ,0x9b,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)"
                           );
            }
            if (pCube1 != pFVar9) {
              do {
                pCube2 = pCube1->pNext;
                if (pCube2 != pFVar9) {
                  pcVar11 = (char *)((long)iVar7 + (long)__s);
                  do {
                    if (*pcVar11 != '\0') {
                      Fxu_MatrixAddDivisor(p,pCube1,pCube2);
                    }
                    pCube2 = pCube2->pNext;
                    pcVar11 = pcVar11 + 1;
                    iVar7 = iVar7 + 1;
                  } while (pCube2 != pFVar9);
                  pCube2 = pCube1->pNext;
                }
                pCube1 = pCube2;
              } while (pCube1 != pFVar9);
              iVar4 = vCovers->nSize;
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar4);
      }
      if (iVar7 != nPairsTotal) {
        __assert_fail("iPair == nPairsTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0xa5,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      if (__s == (void *)0x0) {
        return 1;
      }
      free(__s);
      return 1;
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    free(__s_00);
    pcVar11 = "The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".";
  }
  else {
    if (__s != (void *)0x0) {
      free(__s);
    }
    free(__s_00);
    pcVar11 = "The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".";
  }
  puts(pcVar11);
  return 0;
}

Assistant:

int Fxu_PreprocessCubePairs( Fxu_Matrix * p, Vec_Ptr_t * vCovers, int nPairsTotal, int nPairsMax )
{
    unsigned char * pnLitsDiff;   // storage for the counters of diff literals
    int * pnPairCounters;         // the counters of pairs for each number of diff literals
    Fxu_Cube * pCubeFirst, * pCubeLast;
    Fxu_Cube * pCube1, * pCube2;
    Fxu_Var * pVar;
    int nCubes, nBitsMax, nSum;
    int CutOffNum = -1, CutOffQuant = -1; // Suppress "might be used uninitialized"
    int iPair, iQuant, k, c;
//    abctime clk = Abc_Clock();
    char * pSopCover;
    int nFanins;

    assert( nPairsMax < nPairsTotal );

    // allocate storage for counter of diffs
    pnLitsDiff = ABC_FALLOC( unsigned char, nPairsTotal );
    // go through the covers and precompute the distances between the pairs
    iPair    =  0;
    nBitsMax = -1;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            nFanins = Abc_SopGetVarNum(pSopCover);
            // precompute the differences
            Fxu_CountPairDiffs( pSopCover, pnLitsDiff + iPair );
            // update the counter
            nCubes = Abc_SopGetCubeNum( pSopCover );
            iPair += nCubes * (nCubes - 1) / 2;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    assert( iPair == nPairsTotal );

    // allocate storage for counters of cube pairs by difference
    pnPairCounters = ABC_FALLOC( int, 2 * nBitsMax );
    memset( pnPairCounters, 0, sizeof(int) * 2 * nBitsMax );
    // count the number of different pairs
    for ( k = 0; k < nPairsTotal; k++ )
        pnPairCounters[ pnLitsDiff[k] ]++;
    // determine what pairs to take starting from the lower
    // so that there would be exactly pPairsMax pairs
    if ( pnPairCounters[0] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    if ( pnPairCounters[1] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    assert( pnPairCounters[0] == 0 ); // otherwise, covers are not dup-free
    assert( pnPairCounters[1] == 0 ); // otherwise, covers are not SCC-free
    nSum = 0;
    for ( k = 0; k < 2 * nBitsMax; k++ )
    {
        nSum += pnPairCounters[k];
        if ( nSum >= nPairsMax )
        {
            CutOffNum   = k;
            CutOffQuant = pnPairCounters[k] - (nSum - nPairsMax);
            break;
        }
    }
    ABC_FREE( pnPairCounters );

    // set to 0 all the pairs above the cut-off number and quantity
    iQuant = 0;
    iPair  = 0;
    for ( k = 0; k < nPairsTotal; k++ )
        if ( pnLitsDiff[k] > CutOffNum ) 
            pnLitsDiff[k] = 0;
        else if ( pnLitsDiff[k] == CutOffNum )
        {
            if ( iQuant++ >= CutOffQuant )
                pnLitsDiff[k] = 0;
            else
                iPair++;
        }
        else
            iPair++;
    assert( iPair == nPairsMax );

    // collect the corresponding pairs and add the divisors
    iPair = 0;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            // get the var
            pVar = p->ppVars[2*c+1];
            // get the first cube
            pCubeFirst = pVar->pFirst;
            // get the last cube
            pCubeLast = pCubeFirst;
            for ( k = 0; k < pVar->nCubes; k++ )
                pCubeLast = pCubeLast->pNext;
            assert( pCubeLast == NULL || pCubeLast->pVar != pVar );

            // go through the cube pairs
		    for ( pCube1 = pCubeFirst; pCube1 != pCubeLast; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1->pNext; pCube2 != pCubeLast; pCube2 = pCube2->pNext )
                    if ( pnLitsDiff[iPair++] )
                    {   // create the divisors for this pair
	                    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
                    }
        }
    assert( iPair == nPairsTotal );
    ABC_FREE( pnLitsDiff );
//ABC_PRT( "Preprocess", Abc_Clock() - clk );
    return 1;
}